

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_gen.cpp
# Opt level: O0

bool __thiscall crn::corpus_gen::generate(corpus_gen *this,char *pCmd_line)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  pointer ppVar8;
  file_desc_vec *pfVar9;
  color_quad<unsigned_char,_int> *pcVar10;
  uint *puVar11;
  char *pcVar12;
  float fVar13;
  undefined1 local_2b8 [8];
  dynamic_string dst_filename_1;
  undefined1 local_2a0 [8];
  dynamic_string dst_filename;
  uint local_288;
  uint x_2;
  uint y_2;
  uint dst_block_y;
  uint dst_block_x;
  bool local_268;
  uint local_260;
  uint local_25c;
  uint x_1;
  uint y_1;
  block b;
  uint block_x;
  uint block_y;
  uint block_index;
  uint rand_block_index;
  uint num_blocks_remaining;
  uint i;
  vector<unsigned_int> remaining_blocks;
  uint total_rand_blocks;
  float percentage;
  uint total_blocks;
  uint num_blocks_y;
  uint num_blocks_x;
  uint height;
  uint width;
  uint x;
  uint y;
  image_u8 img;
  file_desc *file_desc;
  uint file_index;
  file_desc_vec *files;
  find_files file_finder;
  dynamic_string *filespec;
  param_map_const_iterator pStack_158;
  uint in_value_index;
  _Self local_150;
  param_map_const_iterator it;
  uint total_blocks_written;
  uint total_images_loaded;
  block_hash_map block_hash;
  random rm;
  uint total_dst_images;
  uint next_dst_block;
  image_u8 dst_img;
  uint total_dst_blocks;
  uint num_dst_blocks_y;
  uint num_dst_blocks_x;
  undefined1 local_60 [8];
  command_line_params params;
  char *pCmd_line_local;
  corpus_gen *this_local;
  
  params.m_param_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pCmd_line;
  crnlib::command_line_params::command_line_params((command_line_params *)local_60);
  bVar1 = crnlib::command_line_params::parse
                    ((command_line_params *)local_60,
                     (char *)params.m_param_map._M_t._M_impl.super__Rb_tree_header._M_node_count,7,
                     generate::param_desc_array,true);
  if (bVar1) {
    bVar1 = crnlib::command_line_params::has_key((command_line_params *)local_60,"in");
    if (bVar1) {
      iVar2 = crnlib::command_line_params::get_value_as_int
                        ((command_line_params *)local_60,"width",0,0x1000,0x80,0x1000,0);
      uVar3 = iVar2 + 3U >> 2;
      iVar2 = crnlib::command_line_params::get_value_as_int
                        ((command_line_params *)local_60,"height",0,0x1000,0x80,0x1000,0);
      uVar4 = iVar2 + 3U >> 2;
      dst_img.m_pixel_buf.m_capacity = uVar3 * uVar4;
      crnlib::color_quad<unsigned_char,_int>::make_black();
      crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)&next_dst_block,uVar3 << 2,
                 uVar4 << 2,0xffffffff,(color_quad<unsigned_char,_int> *)&total_dst_images,0xf);
      rm.m_well512.m_index = 0;
      rm.m_well512.m_state[0xf] = 0;
      crnlib::random::random((random *)&block_hash.m_num_valid);
      crnlib::
      hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
      ::hash_map((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                  *)&total_blocks_written);
      crnlib::
      hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
      ::reserve((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                 *)&total_blocks_written,dst_img.m_pixel_buf.m_capacity);
      it._M_node._4_4_ = 0;
      it._M_node._0_4_ = 0;
      local_150._M_node =
           (_Base_ptr)crnlib::command_line_params::begin((command_line_params *)local_60);
      while( true ) {
        pStack_158 = crnlib::command_line_params::end((command_line_params *)local_60);
        bVar1 = std::operator!=(&local_150,&stack0xfffffffffffffea8);
        if (!bVar1) break;
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                 ::operator->(&local_150);
        bVar1 = crnlib::dynamic_string::operator!=(&ppVar8->first,"in");
        if (!bVar1) {
          ppVar8 = std::
                   _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                   ::operator->(&local_150);
          bVar1 = crnlib::vector<crnlib::dynamic_string>::empty(&(ppVar8->second).m_values);
          if (bVar1) {
            crnlib::console::error("Must follow /in parameter with a filename!\n");
            this_local._7_1_ = 0;
            goto LAB_001071a3;
          }
          filespec._4_4_ = 0;
          while( true ) {
            ppVar8 = std::
                     _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                     ::operator->(&local_150);
            uVar5 = crnlib::vector<crnlib::dynamic_string>::size(&(ppVar8->second).m_values);
            if (uVar5 <= filespec._4_4_) break;
            ppVar8 = std::
                     _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                     ::operator->(&local_150);
            file_finder.m_last_error =
                 (int64)crnlib::vector<crnlib::dynamic_string>::operator[]
                                  (&(ppVar8->second).m_values,filespec._4_4_);
            crnlib::find_files::find_files((find_files *)&files);
            pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)file_finder.m_last_error);
            bVar1 = crnlib::command_line_params::has_key((command_line_params *)local_60,"deep");
            bVar1 = crnlib::find_files::find((find_files *)&files,pcVar12,bVar1 | 4);
            if (bVar1) {
              pfVar9 = crnlib::find_files::get_files((find_files *)&files);
              bVar1 = crnlib::vector<crnlib::find_files::file_desc>::empty(pfVar9);
              if (bVar1) {
                pcVar12 = crnlib::dynamic_string::get_ptr
                                    ((dynamic_string *)file_finder.m_last_error);
                crnlib::console::warning("No files found: %s",pcVar12);
                this_local._7_1_ = 0;
                num_dst_blocks_y = 1;
              }
              else {
                pfVar9 = crnlib::find_files::get_files((find_files *)&files);
                for (file_desc._4_4_ = 0;
                    uVar5 = crnlib::vector<crnlib::find_files::file_desc>::size(pfVar9),
                    file_desc._4_4_ < uVar5; file_desc._4_4_ = file_desc._4_4_ + 1) {
                  img.m_pixel_buf._8_8_ =
                       crnlib::vector<crnlib::find_files::file_desc>::operator[]
                                 (pfVar9,file_desc._4_4_);
                  pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)img.m_pixel_buf._8_8_)
                  ;
                  crnlib::console::printf("Loading image: %s",pcVar12);
                  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x);
                  pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)img.m_pixel_buf._8_8_)
                  ;
                  bVar1 = crnlib::image_utils::read_from_file((image_u8 *)&x,pcVar12,0);
                  if (bVar1) {
                    bVar1 = crnlib::command_line_params::has_key
                                      ((command_line_params *)local_60,"alpha");
                    if (!bVar1) {
                      for (width = 0;
                          uVar5 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_height
                                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x),
                          width < uVar5; width = width + 1) {
                        for (height = 0;
                            uVar5 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                    get_width((image<crnlib::color_quad<unsigned_char,_int>_> *)&x),
                            height < uVar5; height = height + 1) {
                          pcVar10 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                    operator()((image<crnlib::color_quad<unsigned_char,_int>_> *)&x,
                                               height,width);
                          (pcVar10->field_0).field_0.a = 0xff;
                        }
                      }
                    }
                    it._M_node._4_4_ = it._M_node._4_4_ + 1;
                    uVar5 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_width
                                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x);
                    uVar6 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_height
                                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x);
                    uVar4 = uVar5 + 3 >> 2;
                    uVar7 = uVar4 * (uVar6 + 3 >> 2);
                    fVar13 = crnlib::command_line_params::get_value_as_float
                                       ((command_line_params *)local_60,"blockpercentage",0,0.1,
                                        0.001,1.0,0);
                    remaining_blocks.m_capacity =
                         crnlib::math::maximum<unsigned_int>(1,(uint)(long)((float)uVar7 * fVar13));
                    crnlib::vector<unsigned_int>::vector
                              ((vector<unsigned_int> *)&num_blocks_remaining,uVar7);
                    for (rand_block_index = 0; rand_block_index < uVar7;
                        rand_block_index = rand_block_index + 1) {
                      puVar11 = crnlib::vector<unsigned_int>::operator[]
                                          ((vector<unsigned_int> *)&num_blocks_remaining,
                                           rand_block_index);
                      *puVar11 = rand_block_index;
                    }
                    block_index = remaining_blocks.m_capacity;
                    while ((block_index != 0 &&
                           (bVar1 = crnlib::vector<unsigned_int>::empty
                                              ((vector<unsigned_int> *)&num_blocks_remaining),
                           !bVar1))) {
                      uVar5 = crnlib::vector<unsigned_int>::size
                                        ((vector<unsigned_int> *)&num_blocks_remaining);
                      uVar5 = crnlib::random::irand((random *)&block_hash.m_num_valid,0,uVar5);
                      puVar11 = crnlib::vector<unsigned_int>::operator[]
                                          ((vector<unsigned_int> *)&num_blocks_remaining,uVar5);
                      uVar7 = *puVar11;
                      crnlib::vector<unsigned_int>::erase_unordered
                                ((vector<unsigned_int> *)&num_blocks_remaining,uVar5);
                      b.m_c[0xf].field_0 =
                           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                           (uVar7 / uVar4);
                      b.m_c[0xe].field_0 =
                           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                           (uVar7 % uVar4);
                      crn::block::block((block *)&x_1);
                      for (local_25c = 0; local_25c < 4; local_25c = local_25c + 1) {
                        for (local_260 = 0; local_260 < 4; local_260 = local_260 + 1) {
                          pcVar10 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                    get_clamped((image<crnlib::color_quad<unsigned_char,_int>_> *)&x
                                                ,local_260 + (int)b.m_c[0xe].field_0 * 4,
                                                local_25c + (int)b.m_c[0xf].field_0 * 4);
                          crnlib::color_quad<unsigned_char,_int>::operator=
                                    ((color_quad<unsigned_char,_int> *)
                                     (&x_1 + (local_260 + local_25c * 4)),pcVar10);
                        }
                      }
                      crnlib::
                      hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                      ::insert((insert_result *)&dst_block_x,
                               (hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                                *)&total_blocks_written,(block *)&x_1,
                               (empty_type *)((long)&dst_block_y + 3));
                      if (((local_268 ^ 0xffU) & 1) == 0) {
                        uVar5 = crnlib::
                                hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                                ::size((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                                        *)&total_blocks_written);
                        if (uVar5 == dst_img.m_pixel_buf.m_capacity) {
                          crnlib::
                          hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                          ::clear((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                                   *)&total_blocks_written);
                          crnlib::
                          hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                          ::reserve((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                                     *)&total_blocks_written,dst_img.m_pixel_buf.m_capacity);
                        }
                        for (local_288 = 0; local_288 < 4; local_288 = local_288 + 1) {
                          for (dst_filename.m_pStr._4_4_ = 0; dst_filename.m_pStr._4_4_ < 4;
                              dst_filename.m_pStr._4_4_ = dst_filename.m_pStr._4_4_ + 1) {
                            uVar7 = dst_filename.m_pStr._4_4_ + local_288 * 4;
                            pcVar10 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                      operator()((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                                 &next_dst_block,
                                                 dst_filename.m_pStr._4_4_ +
                                                 (rm.m_well512.m_index % uVar3) * 4,
                                                 local_288 + (rm.m_well512.m_index / uVar3) * 4);
                            crnlib::color_quad<unsigned_char,_int>::operator=
                                      (pcVar10,(color_quad<unsigned_char,_int> *)(&x_1 + uVar7));
                          }
                        }
                        rm.m_well512.m_index = rm.m_well512.m_index + 1;
                        if (dst_img.m_pixel_buf.m_capacity == rm.m_well512.m_index) {
                          sort_blocks(this,(image_u8 *)&next_dst_block);
                          crnlib::dynamic_string::dynamic_string
                                    ((dynamic_string *)local_2a0,cVarArg,"test_%u.tga",
                                     (ulong)rm.m_well512.m_state[0xf]);
                          pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_2a0);
                          crnlib::console::printf("Writing image: %s",pcVar12);
                          pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_2a0);
                          crnlib::image_utils::write_to_file
                                    (pcVar12,(image_u8 *)&next_dst_block,0,-1);
                          crnlib::color_quad<unsigned_char,_int>::make_black();
                          crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::set_all
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                     &next_dst_block,
                                     (color_quad<unsigned_char,_int> *)
                                     ((long)&dst_filename_1.m_pStr + 4));
                          rm.m_well512.m_index = 0;
                          rm.m_well512.m_state[0xf] = rm.m_well512.m_state[0xf] + 1;
                          crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_2a0);
                        }
                        it._M_node._0_4_ = (uint)it._M_node + 1;
                        block_index = block_index - 1;
                      }
                    }
                    crnlib::vector<unsigned_int>::~vector
                              ((vector<unsigned_int> *)&num_blocks_remaining);
                  }
                  else {
                    pcVar12 = crnlib::dynamic_string::get_ptr
                                        ((dynamic_string *)img.m_pixel_buf._8_8_);
                    crnlib::console::warning("Failed loading image file: %s",pcVar12);
                  }
                  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x);
                }
                num_dst_blocks_y = 0;
              }
            }
            else {
              pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)file_finder.m_last_error);
              crnlib::console::warning("Failed finding files: %s",pcVar12);
              num_dst_blocks_y = 7;
            }
            crnlib::find_files::~find_files((find_files *)&files);
            if ((num_dst_blocks_y != 0) && (num_dst_blocks_y != 7)) goto LAB_001071a3;
            filespec._4_4_ = filespec._4_4_ + 1;
          }
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
        ::operator++(&local_150);
      }
      if (rm.m_well512.m_index != 0) {
        sort_blocks(this,(image_u8 *)&next_dst_block);
        crnlib::dynamic_string::dynamic_string
                  ((dynamic_string *)local_2b8,cVarArg,"test_%u.tga",
                   (ulong)rm.m_well512.m_state[0xf]);
        pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_2b8);
        crnlib::console::printf("Writing image: %s",pcVar12);
        pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_2b8);
        crnlib::image_utils::write_to_file(pcVar12,(image_u8 *)&next_dst_block,0,-1);
        rm.m_well512.m_state[0xf] = rm.m_well512.m_state[0xf] + 1;
        crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_2b8);
      }
      crnlib::console::printf
                ("Found %u input images, %u output images, %u total blocks",(ulong)it._M_node._4_4_,
                 (ulong)rm.m_well512.m_state[0xf],(ulong)(uint)it._M_node);
      this_local._7_1_ = 1;
LAB_001071a3:
      crnlib::
      hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
      ::~hash_map((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                   *)&total_blocks_written);
      crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)&next_dst_block);
    }
    else {
      crnlib::console::error("Must specify one or more input files using the /in option!");
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  crnlib::command_line_params::~command_line_params((command_line_params *)local_60);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool corpus_gen::generate(const char* pCmd_line)
    {
        static const command_line_params::param_desc param_desc_array[] =
        {
            { "corpus_gen", 0, false },
            { "in", 1, true },
            { "deep", 0, false },
            { "blockpercentage", 1, false },
            { "width", 1, false },
            { "height", 1, false },
            { "alpha", 0, false },
        };

        command_line_params params;
        if (!params.parse(pCmd_line, CRNLIB_ARRAY_SIZE(param_desc_array), param_desc_array, true))
        {
            return false;
        }

        if (!params.has_key("in"))
        {
            console::error("Must specify one or more input files using the /in option!");
            return false;
        }

        uint num_dst_blocks_x = params.get_value_as_int("width", 0, 4096, 128, 4096);
        num_dst_blocks_x = (num_dst_blocks_x + 3) / 4;
        uint num_dst_blocks_y = params.get_value_as_int("height", 0, 4096, 128, 4096);
        num_dst_blocks_y = (num_dst_blocks_y + 3) / 4;

        const uint total_dst_blocks = num_dst_blocks_x * num_dst_blocks_y;
        image_u8 dst_img(num_dst_blocks_x * 4, num_dst_blocks_y * 4);
        uint next_dst_block = 0;
        uint total_dst_images = 0;

        crnlib::random rm;

        block_hash_map block_hash;
        block_hash.reserve(total_dst_blocks);

        uint total_images_loaded = 0;
        uint total_blocks_written = 0;

        command_line_params::param_map_const_iterator it = params.begin();
        for (; it != params.end(); ++it)
        {
            if (it->first != "in")
            {
                continue;
            }

            if (it->second.m_values.empty())
            {
                console::error("Must follow /in parameter with a filename!\n");
                return false;
            }

            for (uint in_value_index = 0; in_value_index < it->second.m_values.size(); in_value_index++)
            {
                const dynamic_string& filespec = it->second.m_values[in_value_index];

                find_files file_finder;
                if (!file_finder.find(filespec.get_ptr(), find_files::cFlagAllowFiles | (params.has_key("deep") ? find_files::cFlagRecursive : 0)))
                {
                    console::warning("Failed finding files: %s", filespec.get_ptr());
                    continue;
                }

                if (file_finder.get_files().empty())
                {
                    console::warning("No files found: %s", filespec.get_ptr());
                    return false;
                }

                const find_files::file_desc_vec& files = file_finder.get_files();

                for (uint file_index = 0; file_index < files.size(); file_index++)
                {
                    const find_files::file_desc& file_desc = files[file_index];

                    console::printf("Loading image: %s", file_desc.m_fullname.get_ptr());

                    image_u8 img;
                    if (!image_utils::read_from_file(img, file_desc.m_fullname.get_ptr(), 0))
                    {
                        console::warning("Failed loading image file: %s", file_desc.m_fullname.get_ptr());
                        continue;
                    }

                    if (!params.has_key("alpha"))
                    {
                        for (uint y = 0; y < img.get_height(); y++)
                        {
                            for (uint x = 0; x < img.get_width(); x++)
                            {
                                img(x, y).a = 255;
                            }
                        }
                    }

                    total_images_loaded++;

                    uint width = img.get_width();
                    uint height = img.get_height();

                    uint num_blocks_x = (width + 3) / 4;
                    uint num_blocks_y = (height + 3) / 4;
                    uint total_blocks = num_blocks_x * num_blocks_y;

                    float percentage = params.get_value_as_float("blockpercentage", 0, .1f, .001f, 1.0f);
                    uint total_rand_blocks = math::maximum<uint>(1U, (uint)(total_blocks * percentage));

                    crnlib::vector<uint> remaining_blocks(total_blocks);
                    for (uint i = 0; i < total_blocks; i++)
                    {
                        remaining_blocks[i] = i;
                    }

                    uint num_blocks_remaining = total_rand_blocks;
                    while (num_blocks_remaining)
                    {
                        if (remaining_blocks.empty())
                        {
                            break;
                        }

                        uint rand_block_index = rm.irand(0, remaining_blocks.size());
                        uint block_index = remaining_blocks[rand_block_index];
                        remaining_blocks.erase_unordered(rand_block_index);

                        uint block_y = block_index / num_blocks_x;
                        uint block_x = block_index % num_blocks_x;

                        block b;

                        for (uint y = 0; y < 4; y++)
                        {
                            for (uint x = 0; x < 4; x++)
                            {
                                b.m_c[x + y * 4] = img.get_clamped(block_x * 4 + x, block_y * 4 + y);
                            }
                        }

                        if (!block_hash.insert(b).second)
                        {
                            continue;
                        }
                        if (block_hash.size() == total_dst_blocks)
                        {
                            block_hash.clear();
                            block_hash.reserve(total_dst_blocks);
                        }

                        uint dst_block_x = next_dst_block % num_dst_blocks_x;
                        uint dst_block_y = next_dst_block / num_dst_blocks_x;
                        for (uint y = 0; y < 4; y++)
                        {
                            for (uint x = 0; x < 4; x++)
                            {
                                dst_img(dst_block_x * 4 + x, dst_block_y * 4 + y) = b.m_c[x + y * 4];
                            }
                        }

                        next_dst_block++;
                        if (total_dst_blocks == next_dst_block)
                        {
                            sort_blocks(dst_img);

                            dynamic_string dst_filename(cVarArg, "test_%u.tga", total_dst_images);
                            console::printf("Writing image: %s", dst_filename.get_ptr());
                            image_utils::write_to_file(dst_filename.get_ptr(), dst_img, 0);

                            dst_img.set_all(color_quad_u8::make_black());

                            next_dst_block = 0;

                            total_dst_images++;
                        }

                        total_blocks_written++;

                        num_blocks_remaining--;
                    }
                } // file_index
            } // in_value_index
        }

        if (next_dst_block)
        {
            sort_blocks(dst_img);

            dynamic_string dst_filename(cVarArg, "test_%u.tga", total_dst_images);
            console::printf("Writing image: %s", dst_filename.get_ptr());
            image_utils::write_to_file(dst_filename.get_ptr(), dst_img, 0);

            next_dst_block = 0;

            total_dst_images++;
        }

        console::printf("Found %u input images, %u output images, %u total blocks", total_images_loaded, total_dst_images, total_blocks_written);

        return true;
    }